

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O3

void __thiscall cfd::core::ByteData256::ByteData256(ByteData256 *this,string *hex)

{
  value_type_conflict *__val;
  pointer puVar1;
  CfdException *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vector;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  undefined1 local_50 [32];
  unsigned_long local_30;
  
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (pointer)operator_new(0x20);
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar1;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar1 + 0x20;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1[0x10] = '\0';
  puVar1[0x11] = '\0';
  puVar1[0x12] = '\0';
  puVar1[0x13] = '\0';
  puVar1[0x14] = '\0';
  puVar1[0x15] = '\0';
  puVar1[0x16] = '\0';
  puVar1[0x17] = '\0';
  puVar1[0x18] = '\0';
  puVar1[0x19] = '\0';
  puVar1[0x1a] = '\0';
  puVar1[0x1b] = '\0';
  puVar1[0x1c] = '\0';
  puVar1[0x1d] = '\0';
  puVar1[0x1e] = '\0';
  puVar1[0x1f] = '\0';
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1 + 0x20;
  StringUtil::StringToByte(&local_68,(string *)hex);
  local_30 = (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  if (local_30 == 0x20) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&local_68);
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  local_50._0_8_ = "cfdcore_bytedata.cpp";
  local_50._8_4_ = 0x111;
  local_50._16_8_ = "ByteData256";
  logger::log<unsigned_long&>
            ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"ByteData256 size unmatch. size={}.",
             &local_30);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._0_8_ = local_50 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"ByteData256 size unmatch.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_50);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData256::ByteData256(const std::string& hex)
    : data_(std::vector<uint8_t>(kByteData256Length)) {
  std::vector<uint8_t> vector = StringUtil::StringToByte(hex);
  if (vector.size() != kByteData256Length) {
    warn(CFD_LOG_SOURCE, "ByteData256 size unmatch. size={}.", vector.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ByteData256 size unmatch.");
  }
  data_ = vector;
}